

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O0

bool __thiscall NonrecursiveInotifyPoller::AddWatch(NonrecursiveInotifyPoller *this,string *path)

{
  int __fd;
  char *pcVar1;
  bool bVar2;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  int local_24;
  string *psStack_20;
  int watch;
  string *path_local;
  NonrecursiveInotifyPoller *this_local;
  
  psStack_20 = path;
  path_local = (string *)this;
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)path);
  if (*pcVar1 == '/') {
    __fd = this->fd_;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    local_24 = inotify_add_watch(__fd,pcVar1,0x7c2);
    bVar2 = -1 < local_24;
    if (bVar2) {
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int_&,_true>(&local_50,&local_24,psStack_20);
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert(&this->directories_,&local_50);
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_50);
    }
    return bVar2;
  }
  __assert_fail("path[path.size() - 1] == \'/\' && \"Directory names must end with a trailing slash\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x20,"virtual bool NonrecursiveInotifyPoller::AddWatch(const std::string &)");
}

Assistant:

bool NonrecursiveInotifyPoller::AddWatch(const std::string& path) {
  // Create new inotify watch.
  assert(path[path.size() - 1] == '/' &&
         "Directory names must end with a trailing slash");
  int watch = inotify_add_watch(
      fd_, path.c_str(), IN_CREATE | IN_DELETE | IN_DELETE_SELF | IN_MODIFY |
                             IN_MOVED_FROM | IN_MOVED_TO);
  if (watch < 0)
    return false;

  // Keep track of watch and pathname string, so we can recombine events to
  // full pathname strings.
  directories_.insert({watch, path});
  return true;
}